

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

bool __thiscall
miniros::Subscription::addCallback
          (Subscription *this,SubscriptionCallbackHelperPtr *helper,string *md5sum,
          CallbackQueueInterface *queue,int32_t queue_size,VoidConstPtr *tracked_object,
          bool allow_concurrent_callbacks)

{
  pointer psVar1;
  CallbackQueueInterface *pCVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  pthread_mutex_t *__mutex;
  pointer __k;
  bool was_full;
  bool allow_concurrent_callbacks_local;
  pthread_mutex_t *local_98;
  SerializedMessage *local_90;
  int32_t queue_size_local;
  CallbackInfoPtr info;
  shared_ptr<miniros::MessageDeserializer> des;
  __shared_ptr<miniros::CallbackInterface,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  allow_concurrent_callbacks_local = allow_concurrent_callbacks;
  local_90 = (SerializedMessage *)queue;
  queue_size_local = queue_size;
  std::mutex::lock(&this->md5sum_mutex_);
  bVar3 = std::operator==(&this->md5sum_,"*");
  if ((bVar3) && (bVar3 = std::operator!=(md5sum,"*"), bVar3)) {
    std::__cxx11::string::_M_assign((string *)&this->md5sum_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->md5sum_mutex_);
  bVar3 = std::operator!=(md5sum,"*");
  if (bVar3) {
    md5sum_abi_cxx11_((string *)&info,this);
    bVar3 = std::operator!=(md5sum,(string *)&info);
    std::__cxx11::string::~string((string *)&info);
    if (bVar3) {
      return false;
    }
  }
  __mutex = (pthread_mutex_t *)&this->callbacks_mutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  std::make_shared<miniros::Subscription::CallbackInfo>();
  std::__shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((info.
                super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->helper_).
              super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>,
             &helper->
              super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>);
  (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->callback_queue_ = (CallbackQueueInterface *)local_90;
  std::make_shared<miniros::SubscriptionQueue,std::__cxx11::string&,int&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&des,
             (int *)&this->name_,(bool *)&queue_size_local);
  std::__shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((info.
                super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->subscription_queue_).
              super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2> *)&des);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_ptr<void_const,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<void_const,(__gnu_cxx::_Lock_policy)2> *)
             &(info.
               super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->tracked_object_,
             &tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>);
  (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->has_tracked_object_ =
       (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
       (element_type *)0x0;
  iVar4 = (*((helper->
             super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_SubscriptionCallbackHelper[5])();
  if ((char)iVar4 == '\0') {
    this->nonconst_callbacks_ = this->nonconst_callbacks_ + 1;
  }
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::push_back(&this->callbacks_,&info);
  std::
  vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ::reserve(&this->cached_deserializers_,
            (long)(this->callbacks_).
                  super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->callbacks_).
                  super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  if ((this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_98 = __mutex;
    local_90 = (SerializedMessage *)helper;
    std::mutex::lock(&this->publisher_links_mutex_);
    psVar1 = (this->publisher_links_).
             super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (this->publisher_links_).
               super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != psVar1; __k = __k + 1) {
      if ((((__k->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           latched_ == true) &&
         (iVar5 = std::
                  _Rb_tree<std::shared_ptr<miniros::PublisherLink>,_std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>,_std::_Select1st<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
                  ::find(&(this->latched_messages_)._M_t,__k),
         (_Rb_tree_header *)iVar5._M_node !=
         &(this->latched_messages_)._M_t._M_impl.super__Rb_tree_header)) {
        std::
        make_shared<miniros::MessageDeserializer,std::shared_ptr<miniros::SubscriptionCallbackHelper>const&,miniros::SerializedMessage_const&,std::shared_ptr<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>const&>
                  ((shared_ptr<miniros::SubscriptionCallbackHelper> *)&des,local_90,
                   (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&iVar5._M_node[1]._M_left);
        was_full = false;
        SubscriptionQueue::push
                  (((info.
                     super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->subscription_queue_).
                   super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,&(info.
                      super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->helper_,&des,
                   (info.
                    super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->has_tracked_object_,
                   &(info.
                     super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->tracked_object_,true,(Time)iVar5._M_node[4]._M_parent,&was_full);
        if (was_full == false) {
          pCVar2 = (info.
                    super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->callback_queue_;
          std::__shared_ptr<miniros::CallbackInterface,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<miniros::SubscriptionQueue,void>
                    (local_40,&((info.
                                 super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->subscription_queue_).
                               super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>
                    );
          (*pCVar2->_vptr_CallbackQueueInterface[2])
                    (pCVar2,local_40,
                     info.
                     super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
    __mutex = local_98;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&info.
              super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pthread_mutex_unlock(__mutex);
  return true;
}

Assistant:

bool Subscription::addCallback(const SubscriptionCallbackHelperPtr& helper, const std::string& md5sum,
  CallbackQueueInterface* queue, int32_t queue_size, const VoidConstPtr& tracked_object, bool allow_concurrent_callbacks)
{
  MINIROS_ASSERT(helper);
  MINIROS_ASSERT(queue);


  // Decay to a real type as soon as we have a subscriber with a real type
  {
    std::scoped_lock<std::mutex> lock(md5sum_mutex_);
    if (md5sum_ == "*" && md5sum != "*")
    {

      md5sum_ = md5sum;
    }
  }

  if (md5sum != "*" && md5sum != this->md5sum())
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(callbacks_mutex_);

    CallbackInfoPtr info(std::make_shared<CallbackInfo>());
    info->helper_ = helper;
    info->callback_queue_ = queue;
    info->subscription_queue_ = std::make_shared<SubscriptionQueue>(name_, queue_size, allow_concurrent_callbacks);
    info->tracked_object_ = tracked_object;
    info->has_tracked_object_ = false;
    if (tracked_object)
    {
      info->has_tracked_object_ = true;
    }

    if (!helper->isConst())
    {
      ++nonconst_callbacks_;
    }

    callbacks_.push_back(info);
    cached_deserializers_.reserve(callbacks_.size());

    // if we have any latched links, we need to immediately schedule callbacks
    if (!latched_messages_.empty())
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

      for (const PublisherLinkPtr& link: publisher_links_)
      {
        if (!link->isLatched())
          continue;

        auto des_it = latched_messages_.find(link);
        if (des_it == latched_messages_.end())
          continue;

        const LatchInfo& latch_info = des_it->second;
        auto des = std::make_shared<MessageDeserializer>(helper, latch_info.message, latch_info.connection_header);
        bool was_full = false;
        info->subscription_queue_->push(info->helper_, des, info->has_tracked_object_, info->tracked_object_, true, latch_info.receipt_time, &was_full);
        if (!was_full)
        {
          info->callback_queue_->addCallback(info->subscription_queue_, (uint64_t)info.get());
        }
      }
    }
  }

  return true;
}